

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

void __thiscall
cnn::KMaxPooling::backward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Dim *d;
  float fVar1;
  void *pvVar2;
  uint p;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint k;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint local_a4;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  uVar10 = (ulong)(this->super_Node).dim.d[0];
  local_a4 = 1;
  if (1 < (this->super_Node).dim.nd) {
    local_a4 = (this->super_Node).dim.d[1];
  }
  if (uVar10 != 0) {
    d = &(this->super_Node).dim;
    pvVar2 = (this->super_Node).aux_mem;
    uVar11 = 0;
    do {
      if (local_a4 != 0) {
        uVar8 = 0;
        do {
          uVar6 = (ulong)(this->super_Node).dim.nd;
          iVar3 = 1;
          if (uVar6 != 0) {
            uVar7 = 0;
            do {
              iVar3 = iVar3 * d->d[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
          if (iVar3 * (this->super_Node).dim.bd <= (uint)uVar8) {
            __assert_fail("mi < dim.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/conv.cc"
                          ,0x14d,
                          "virtual void cnn::KMaxPooling::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                         );
          }
          iVar3 = *(int *)((long)pvVar2 + uVar8 * 4);
          lVar12 = (long)iVar3;
          Tensor::operator*(&local_70,dEdxi);
          if ((lVar12 < 0) ||
             (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value < lVar12)) {
            poVar5 = operator<<((ostream *)&std::cerr,d);
            Tensor::operator*(&local_70,fx);
            poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                                               *)&local_70);
            poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
            Tensor::operator*(&local_50,dEdxi);
            poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                                               *)&local_50);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MM:",3);
            uVar10 = 0;
            while( true ) {
              uVar11 = (ulong)(this->super_Node).dim.nd;
              iVar4 = 1;
              if (uVar11 != 0) {
                uVar8 = 0;
                do {
                  iVar4 = iVar4 * d->d[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar11 != uVar8);
              }
              if (iVar4 * (this->super_Node).dim.bd <= uVar10) break;
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data._0_1_ = 0x20;
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)&local_70,1);
              std::ostream::operator<<(poVar5,*(int *)((long)pvVar2 + uVar10 * 4));
              uVar10 = uVar10 + 1;
            }
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            poVar5 = std::operator<<((ostream *)&std::cerr,"BAD: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
            std::endl<char,std::char_traits<char>>(poVar5);
            abort();
          }
          Tensor::operator*(&local_70,dEdf);
          if ((local_70.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value <= (long)uVar11) ||
             (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= (long)uVar8)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 0]"
                         );
          }
          fVar1 = *(float *)(local_70.
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             .m_rows.m_value * uVar8 * 4 +
                             CONCAT71(local_70.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                      .m_data._1_7_,
                                      local_70.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                      .m_data._0_1_) + uVar11 * 4);
          Tensor::operator*(&local_50,dEdxi);
          if ((local_50.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value <= (long)uVar11) ||
             (local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= lVar12)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                         );
          }
          uVar9 = (uint)uVar8 + 1;
          uVar8 = (ulong)uVar9;
          local_50.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data[local_50.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value * lVar12 + uVar11] =
               fVar1 + local_50.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data[local_50.
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               .
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                               .m_rows.m_value * lVar12 + uVar11];
        } while (uVar9 != local_a4);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  return;
}

Assistant:

void KMaxPooling::backward_impl(const vector<const Tensor*>& xs,
                           const Tensor& fx,
                           const Tensor& dEdf,
                           unsigned i,
                           Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::backward not implemented for CUDA");
#else
  const unsigned rows = dim.rows();
  const unsigned cols = dim.cols();
  const int* maxmap = static_cast<const int*>(aux_mem);
  for (unsigned i = 0; i < rows; ++i) {
    unsigned mi = 0;
    for (unsigned j = 0; j < cols; ++j) {
      assert(mi < dim.size());
      const int oj = maxmap[mi++];
      if (oj > (*dEdxi).cols() || oj < 0) {
        cerr << dim << (*fx) << endl << (*dEdxi) << endl;
        cerr << "MM:"; for (unsigned k=0;k < dim.size(); ++k) cerr << ' ' << maxmap[k];
        cerr << endl;
        cerr << "BAD: " << oj << endl; abort();
      }
      (*dEdxi)(i, oj) += (*dEdf)(i, j);
    }
  }
#endif
}